

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O1

vector<record,_std::allocator<record>_> * __thiscall
Tree::search(vector<record,_std::allocator<record>_> *__return_storage_ptr__,Tree *this,int key,
            Vertex *root)

{
  int iVar1;
  
  while( true ) {
    while( true ) {
      if (root == (Vertex *)0x0) {
        (__return_storage_ptr__->super__Vector_base<record,_std::allocator<record>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<record,_std::allocator<record>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<record,_std::allocator<record>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return __return_storage_ptr__;
      }
      iVar1 = (int)((root->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
                    super__Vector_impl_data._M_start)->year;
      if (iVar1 <= key) break;
      root = root->ptrLeft;
    }
    if (key <= iVar1) break;
    root = root->ptrRight;
  }
  std::vector<record,_std::allocator<record>_>::vector(__return_storage_ptr__,&root->data);
  return __return_storage_ptr__;
}

Assistant:

vector<record> search(int key, Vertex *root) {
        vector<record> tempVector;
        if (!root) return tempVector;
        if (key < root->data[0].year)
            return search(key, root->ptrLeft);
        else if (key > root->data[0].year)
            return search(key, root->ptrRight);
        return root->data;
    }